

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

void Gia_ManConvertPackingToEdges(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  uint local_3c;
  int local_38;
  int Count;
  int nNodes [4];
  int nEntries2;
  int nEntries;
  int Entry;
  int k;
  int i;
  Gia_Man_t *p_local;
  
  local_3c = 0;
  if (p->vPacking != (Vec_Int_t *)0x0) {
    Vec_IntFreeP(&p->vEdge1);
    Vec_IntFreeP(&p->vEdge2);
    iVar1 = Gia_ManObjNum(p);
    pVVar6 = Vec_IntStart(iVar1);
    p->vEdge1 = pVVar6;
    iVar1 = Gia_ManObjNum(p);
    pVVar6 = Vec_IntStart(iVar1);
    p->vEdge2 = pVVar6;
    iVar1 = Vec_IntEntry(p->vPacking,0);
    nNodes[3] = 0;
    Entry = 1;
    while (iVar2 = Vec_IntSize(p->vPacking), Entry < iVar2) {
      iVar2 = Vec_IntEntry(p->vPacking,Entry);
      if ((iVar2 < 1) || (3 < iVar2)) {
        __assert_fail("Entry > 0 && Entry < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x84,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
      }
      for (nEntries = 0; Entry = Entry + 1, nEntries < iVar2; nEntries = nEntries + 1) {
        iVar3 = Vec_IntEntry(p->vPacking,Entry);
        (&local_38)[nEntries] = iVar3;
      }
      nNodes[3] = nNodes[3] + 1;
      if (iVar2 == 2) {
        iVar2 = Gia_ObjEdgeAdd(local_38,Count,p->vEdge1,p->vEdge2);
        iVar3 = Gia_ObjEdgeAdd(Count,local_38,p->vEdge1,p->vEdge2);
        local_3c = iVar3 + iVar2 + local_3c;
      }
      else if (iVar2 == 3) {
        iVar2 = Gia_ObjEdgeAdd(local_38,nNodes[0],p->vEdge1,p->vEdge2);
        iVar3 = Gia_ObjEdgeAdd(nNodes[0],local_38,p->vEdge1,p->vEdge2);
        iVar4 = Gia_ObjEdgeAdd(Count,nNodes[0],p->vEdge1,p->vEdge2);
        iVar5 = Gia_ObjEdgeAdd(nNodes[0],Count,p->vEdge1,p->vEdge2);
        local_3c = iVar5 + iVar4 + iVar3 + iVar2 + local_3c;
      }
    }
    if (iVar1 != nNodes[3]) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x98,"void Gia_ManConvertPackingToEdges(Gia_Man_t *)");
    }
    if (local_3c != 0) {
      printf("Skipped %d illegal edges.\n",(ulong)local_3c);
    }
  }
  return;
}

Assistant:

void Gia_ManConvertPackingToEdges( Gia_Man_t * p )
{
    int i, k, Entry, nEntries, nEntries2, nNodes[4], Count = 0;
    if ( p->vPacking == NULL )
        return;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // iterate through structures
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
            nNodes[k] = Vec_IntEntry(p->vPacking, i);
        i--;
        nEntries2++;
        // create edges
        if ( Entry == 2 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[1], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[0], p->vEdge1, p->vEdge2 );
        }
        else if ( Entry == 3 )
        {
            Count += Gia_ObjEdgeAdd( nNodes[0], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[0], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[1], nNodes[2], p->vEdge1, p->vEdge2 );
            Count += Gia_ObjEdgeAdd( nNodes[2], nNodes[1], p->vEdge1, p->vEdge2 );
        }
    }
    assert( nEntries == nEntries2 );
    if ( Count )
        printf( "Skipped %d illegal edges.\n", Count );
}